

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_EDX;
  ImRect *in_RSI;
  ImRect *in_RDI;
  ImGuiID in_R8D;
  ImGuiID in_R9D;
  float fVar3;
  undefined8 in_XMM0_Qa;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  float in_stack_00000028;
  float ellipsis_max_x;
  ImGuiID in_stack_00000030;
  undefined4 in_stack_00000034;
  float close_button_sz;
  ImGuiItemHoveredDataBackup last_item_backup;
  bool close_button_visible;
  bool close_button_pressed;
  ImRect text_ellipsis_clip_bb;
  ImVec2 unsaved_marker_pos;
  ImRect text_pixel_clip_bb;
  char *TAB_UNSAVED_MARKER;
  ImVec2 label_size;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff08;
  ImGuiItemHoveredDataBackup *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined1 repeat;
  ImGuiMouseButton button;
  ImRect *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ImVec2 in_stack_ffffffffffffff38;
  ImGuiID in_stack_ffffffffffffff44;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar6;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ImVec2 in_stack_ffffffffffffff80;
  ImVec2 in_stack_ffffffffffffff90;
  float local_68;
  ImVec2 *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float local_48;
  float local_c;
  float fStack_8;
  bool local_1;
  
  pIVar1 = GImGui;
  IVar4 = CalcTextSize((char *)in_stack_ffffffffffffff38,
                       (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                       (float)in_stack_ffffffffffffff28);
  fVar3 = ImRect::GetWidth(in_RSI);
  if (1.0 < fVar3) {
    ImRect::ImRect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                   (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                   SUB84(in_stack_ffffffffffffff10,0));
    local_c = (float)in_XMM0_Qa;
    if ((in_EDX & 1) != 0) {
      IVar5 = CalcTextSize((char *)in_stack_ffffffffffffff38,
                           (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                           (float)in_stack_ffffffffffffff28);
      local_68 = IVar5.x;
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 - local_68;
      local_48 = IVar4.x;
      fVar3 = ImMin<float>((in_RSI->Min).x + local_c + local_48 + 2.0,in_stack_ffffffffffffffa8);
      fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,fVar3,
                     (in_RSI->Min).y + fStack_8 + (float)(int)(pIVar1->FontSize * -0.25));
      IVar4 = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x221364);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
      in_stack_ffffffffffffff10 = (ImGuiItemHoveredDataBackup *)0x0;
      RenderTextClippedEx((ImDrawList *)in_stack_ffffffffffffff90,(ImVec2 *)IVar4,
                          (ImVec2 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,
                          (ImVec2 *)
                          CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                          in_stack_ffffffffffffffa0,
                          (ImRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffff20 = in_RDI;
    }
    bVar6 = 0;
    bVar2 = false;
    if ((in_R9D != 0) &&
       (((pIVar1->HoveredId == in_R8D || (pIVar1->HoveredId == in_R9D)) ||
        (pIVar1->ActiveId == in_R9D)))) {
      bVar2 = true;
    }
    if (bVar2) {
      ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup(in_stack_ffffffffffffff10);
      fVar3 = pIVar1->FontSize;
      PushStyleVar(in_stack_ffffffffffffff44,(ImVec2 *)in_stack_ffffffffffffff38);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff38,
                     (-local_c + -local_c + (in_RSI->Max).x) - fVar3,(in_RSI->Min).y);
      repeat = (undefined1)(in_R9D >> 0x18);
      bVar2 = CloseButton(in_stack_00000030,(ImVec2 *)CONCAT44(ellipsis_max_x,in_stack_00000028));
      if (bVar2) {
        bVar6 = 1;
      }
      PopStyleVar((int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      button = (ImGuiMouseButton)in_stack_ffffffffffffff20;
      ImGuiItemHoveredDataBackup::Restore((ImGuiItemHoveredDataBackup *)&stack0xffffffffffffff44);
      if (((in_EDX & 4) == 0) && (bVar2 = IsMouseClicked(button,(bool)repeat), bVar2)) {
        bVar6 = 1;
      }
    }
    RenderTextEllipsis((ImDrawList *)last_item_backup._4_8_,_close_button_sz,
                       (ImVec2 *)CONCAT44(in_stack_00000034,in_stack_00000030),ellipsis_max_x,
                       in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    local_1 = (bool)(bVar6 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

    return close_button_pressed;
}